

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::validateMathMLElements
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component)

{
  XmlNodePtr local_30;
  
  XmlNode::firstChild((XmlNode *)&local_30);
  validateMathMLElement(this,&local_30,component);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  XmlNode::next((XmlNode *)&local_30);
  validateMathMLElement(this,&local_30,component);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateMathMLElements(const XmlNodePtr &node, const ComponentPtr &component)
{
    validateMathMLElement(node->firstChild(), component);
    validateMathMLElement(node->next(), component);
}